

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O0

void cf2_doBlend(CFF_Blend blend,CF2_Stack opStack,FT_UFast numBlends)

{
  int iVar1;
  FT_UFast FVar2;
  int iVar3;
  CF2_F16Dot16 b;
  FT_Int32 FVar4;
  int local_3c;
  FT_Int32 *pFStack_38;
  CF2_F16Dot16 sum;
  CF2_F16Dot16 *weight;
  FT_UFast numOperands;
  FT_UFast j;
  FT_UFast i;
  FT_UFast base;
  FT_UFast delta;
  FT_UFast numBlends_local;
  CF2_Stack opStack_local;
  CFF_Blend blend_local;
  
  iVar1 = numBlends * blend->lenBV;
  FVar2 = cf2_stack_count(opStack);
  iVar3 = FVar2 - iVar1;
  i = iVar3 + numBlends;
  for (numOperands = 0; numOperands < numBlends; numOperands = numOperands + 1) {
    pFStack_38 = blend->BV;
    local_3c = cf2_stack_getReal(opStack,numOperands + iVar3);
    for (weight._4_4_ = 1; pFStack_38 = pFStack_38 + 1, weight._4_4_ < blend->lenBV;
        weight._4_4_ = weight._4_4_ + 1) {
      FVar4 = *pFStack_38;
      b = cf2_stack_getReal(opStack,i);
      FVar4 = FT_MulFix_x86_64(FVar4,b);
      local_3c = local_3c + FVar4;
      i = i + 1;
    }
    cf2_stack_setReal(opStack,numOperands + iVar3,local_3c);
  }
  cf2_stack_pop(opStack,iVar1 - numBlends);
  return;
}

Assistant:

static void
  cf2_doBlend( const CFF_Blend  blend,
               CF2_Stack        opStack,
               CF2_UInt         numBlends )
  {
    CF2_UInt  delta;
    CF2_UInt  base;
    CF2_UInt  i, j;
    CF2_UInt  numOperands = (CF2_UInt)( numBlends * blend->lenBV );


    base  = cf2_stack_count( opStack ) - numOperands;
    delta = base + numBlends;

    for ( i = 0; i < numBlends; i++ )
    {
      const CF2_Fixed*  weight = &blend->BV[1];

      /* start with first term */
      CF2_Fixed  sum = cf2_stack_getReal( opStack, i + base );


      for ( j = 1; j < blend->lenBV; j++ )
        sum = ADD_INT32( sum,
                         FT_MulFix( *weight++,
                                    cf2_stack_getReal( opStack,
                                                       delta++ ) ) );

      /* store blended result  */
      cf2_stack_setReal( opStack, i + base, sum );
    }

    /* leave only `numBlends' results on stack */
    cf2_stack_pop( opStack, numOperands - numBlends );
  }